

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlFeatures.cpp
# Opt level: O2

void __thiscall
GdlFeatureSetting::SetLabelFromNameTable
          (GdlFeatureSetting *this,int nNameID,int nLangID,uint8 *pNameTbl)

{
  undefined4 in_register_00000034;
  uint8 *in_R8;
  wstring stuName;
  wstring local_60;
  wstring local_40;
  
  GdlFeatureDefn::GetLabelFromNameTable_abi_cxx11_
            (&local_40,(GdlFeatureDefn *)CONCAT44(in_register_00000034,nNameID),nLangID,
             (int)pNameTbl,in_R8);
  if (local_40._M_string_length != 0) {
    std::__cxx11::wstring::wstring((wstring *)&local_60,(wstring *)&local_40);
    AddExtName(this,(utf16)nLangID,&local_60);
    std::__cxx11::wstring::~wstring((wstring *)&local_60);
    this->m_wNameTblId = (unsigned_short)nNameID;
  }
  std::__cxx11::wstring::~wstring((wstring *)&local_40);
  return;
}

Assistant:

void GdlFeatureSetting::SetLabelFromNameTable(int nNameID, int nLangID, uint8 * pNameTbl)
{
	std::wstring stuName = GdlFeatureDefn::GetLabelFromNameTable(nNameID, nLangID, pNameTbl);
	if (stuName.length() != 0)
	{
		AddExtName(nLangID, stuName);
		m_wNameTblId = nNameID;
	}
}